

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts5ConfigParseRank(char *zIn,char **pzRank,char **pzRankArgs)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  char *p;
  char *pcVar4;
  char *pIn;
  char *pcVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  size_t __n;
  byte *__src;
  char *__src_00;
  ulong uVar9;
  char *pcVar10;
  long in_FS_OFFSET;
  int rc;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  pcVar4 = (char *)0x0;
  *pzRank = (char *)0x0;
  *pzRankArgs = (char *)0x0;
  iVar6 = 1;
  iVar7 = iVar6;
  if (zIn != (char *)0x0) {
    pcVar4 = zIn + -1;
    pbVar1 = (byte *)zIn;
    do {
      __src = pbVar1;
      __src_00 = pcVar4;
      bVar3 = *__src;
      zIn = zIn + 1;
      pcVar4 = __src_00 + 1;
      pbVar1 = __src + 1;
    } while (bVar3 == 0x20);
    uVar9 = 0;
    while (((char)bVar3 < '\0' || ((&DAT_00206ae0)[bVar3] != '\0'))) {
      pbVar1 = (byte *)(__src_00 + 2);
      __src_00 = __src_00 + 1;
      uVar9 = uVar9 - 1;
      bVar3 = *pbVar1;
    }
    if (uVar9 == 0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = (char *)sqlite3Fts5MallocZero(&local_3c,1 - uVar9);
      if (pcVar4 != (char *)0x0) {
        memcpy(pcVar4,__src,-uVar9);
      }
      iVar7 = local_3c;
      if (local_3c == 0) {
        pcVar10 = zIn + ~uVar9;
        do {
          pcVar5 = __src_00 + 1;
          __src_00 = __src_00 + 1;
          pcVar10 = pcVar10 + 1;
        } while (*pcVar5 == ' ');
        iVar7 = iVar6;
        if (*pcVar5 == '(') {
          do {
            pcVar5 = __src_00 + 1;
            __src_00 = __src_00 + 1;
            pcVar10 = pcVar10 + 1;
          } while (*pcVar5 == ' ');
          if (*pcVar5 == ')') {
            pcVar10 = (char *)0x0;
          }
          else {
            pcVar5 = __src_00;
            do {
              do {
                pIn = pcVar5;
                pcVar5 = pIn + 1;
              } while (*pIn == ' ');
              pcVar5 = fts5ConfigSkipLiteral(pIn);
              if (pcVar5 == (char *)0x0) goto LAB_001dd78c;
              __n = (long)pcVar5 - (long)pcVar10;
              do {
                sVar8 = __n;
                cVar2 = *pcVar5;
                pcVar5 = pcVar5 + 1;
                __n = sVar8 + 1;
              } while (cVar2 == ' ');
            } while (cVar2 == ',');
            if (cVar2 != ')') goto LAB_001dd78c;
            pcVar10 = (char *)sqlite3Fts5MallocZero(&local_3c,sVar8 + 2);
            if (pcVar10 == (char *)0x0) {
              pcVar10 = (char *)0x0;
            }
            else {
              memcpy(pcVar10,__src_00,__n);
            }
          }
          iVar7 = local_3c;
          if (local_3c == 0) {
            *pzRank = pcVar4;
            *pzRankArgs = pcVar10;
            iVar7 = 0;
            goto LAB_001dd794;
          }
        }
      }
    }
  }
LAB_001dd78c:
  sqlite3_free(pcVar4);
LAB_001dd794:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar7;
}

Assistant:

static int sqlite3Fts5ConfigParseRank(
  const char *zIn,                /* Input string */
  char **pzRank,                  /* OUT: Rank function name */
  char **pzRankArgs               /* OUT: Rank function arguments */
){
  const char *p = zIn;
  const char *pRank;
  char *zRank = 0;
  char *zRankArgs = 0;
  int rc = SQLITE_OK;

  *pzRank = 0;
  *pzRankArgs = 0;

  if( p==0 ){
    rc = SQLITE_ERROR;
  }else{
    p = fts5ConfigSkipWhitespace(p);
    pRank = p;
    p = fts5ConfigSkipBareword(p);

    if( p ){
      zRank = sqlite3Fts5MallocZero(&rc, 1 + p - pRank);
      if( zRank ) memcpy(zRank, pRank, p-pRank);
    }else{
      rc = SQLITE_ERROR;
    }

    if( rc==SQLITE_OK ){
      p = fts5ConfigSkipWhitespace(p);
      if( *p!='(' ) rc = SQLITE_ERROR;
      p++;
    }
    if( rc==SQLITE_OK ){
      const char *pArgs;
      p = fts5ConfigSkipWhitespace(p);
      pArgs = p;
      if( *p!=')' ){
        p = fts5ConfigSkipArgs(p);
        if( p==0 ){
          rc = SQLITE_ERROR;
        }else{
          zRankArgs = sqlite3Fts5MallocZero(&rc, 1 + p - pArgs);
          if( zRankArgs ) memcpy(zRankArgs, pArgs, p-pArgs);
        }
      }
    }
  }

  if( rc!=SQLITE_OK ){
    sqlite3_free(zRank);
    assert( zRankArgs==0 );
  }else{
    *pzRank = zRank;
    *pzRankArgs = zRankArgs;
  }
  return rc;
}